

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directives.cpp
# Opt level: O1

bool DirectiveMessage(ArgumentList *List,int flags)

{
  bool bVar1;
  CDirectiveMessage *this;
  
  if (flags - 1U < 3) {
    this = (CDirectiveMessage *)operator_new(0x38);
    CAssemblerCommand::CAssemblerCommand((CAssemblerCommand *)this);
    (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
         (_func_int **)&PTR__CDirectiveMessage_00172e30;
    (this->message)._M_dataplus._M_p = (pointer)&(this->message).field_2;
    (this->message)._M_string_length = 0;
    (this->message).field_2._M_local_buf[0] = L'\0';
    this->errorType = Invalid;
    bVar1 = CDirectiveMessage::Load(this,List,flags);
    if (bVar1) {
      AddAssemblerCommand((CAssemblerCommand *)0x13cde7);
    }
    else {
      (*(this->super_CAssemblerCommand)._vptr_CAssemblerCommand[1])(this);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool DirectiveMessage(ArgumentList& List, int flags)
{
	CDirectiveMessage::Type value;

	switch (flags)
	{
	case DIRECTIVE_MSG_WARNING:		value = CDirectiveMessage::Type::Warning;	break;
	case DIRECTIVE_MSG_ERROR:		value = CDirectiveMessage::Type::Error;		break;
	case DIRECTIVE_MSG_NOTICE:		value = CDirectiveMessage::Type::Notice;	break;
	default: return false;
	}

	CDirectiveMessage* Command = new CDirectiveMessage();
	if (Command->Load(List,value) == false)
	{
		delete Command;
		return false;
	}

	AddAssemblerCommand(Command);
	return true;
}